

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O1

ssl_open_record_t bssl::skip_early_data(SSL *ssl,uint8_t *out_alert,size_t consumed)

{
  ssl_open_record_t sVar1;
  ushort uVar2;
  ushort uVar3;
  
  uVar2 = ssl->s3->early_data_skipped + (short)consumed;
  uVar3 = 0x4001;
  if (consumed <= uVar2) {
    uVar3 = uVar2;
  }
  ssl->s3->early_data_skipped = uVar3;
  sVar1 = ssl_open_record_discard;
  if (0x4000 < uVar3) {
    ERR_put_error(0x10,0,0x10e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                  ,0x46);
    *out_alert = '\n';
    sVar1 = ssl_open_record_error;
  }
  return sVar1;
}

Assistant:

static ssl_open_record_t skip_early_data(SSL *ssl, uint8_t *out_alert,
                                         size_t consumed) {
  ssl->s3->early_data_skipped += consumed;
  if (ssl->s3->early_data_skipped < consumed) {
    ssl->s3->early_data_skipped = kMaxEarlyDataSkipped + 1;
  }

  if (ssl->s3->early_data_skipped > kMaxEarlyDataSkipped) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MUCH_SKIPPED_EARLY_DATA);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  return ssl_open_record_discard;
}